

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O2

Sprite * make_flair(int image,float x,float y,float end_time)

{
  Flair *pFVar1;
  
  pFVar1 = (Flair *)malloc(0x180);
  init_sprite(&pFVar1->sprite,image,x,y,1.0,1.0);
  pFVar1->end_time = end_time;
  pFVar1->next = flairs;
  flairs = pFVar1;
  return &pFVar1->sprite;
}

Assistant:

static Sprite *make_flair(int image, float x, float y, float end_time)
{
   Flair *fl = malloc(sizeof *fl);
   init_sprite(&fl->sprite, image, x, y, 1.0, 1.0);
   fl->end_time = end_time;
   fl->next = flairs;
   flairs = fl;
   return &fl->sprite;
}